

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1decode.c
# Opt level: O2

FT_Error t1_decoder_parse_metrics
                   (T1_Decoder_conflict decoder,FT_Byte *charstring_base,FT_UInt charstring_len)

{
  FT_Vector *pFVar1;
  FT_Pos *pFVar2;
  FT_Long *pFVar3;
  ulong *puVar4;
  byte bVar5;
  long *plVar6;
  FT_Byte **ppFVar7;
  bool bVar8;
  FT_Long FVar9;
  size_t *psVar10;
  uint uVar11;
  T1_Decoder_Zone pTVar12;
  uint uVar13;
  bool bVar14;
  byte *pbVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  FT_Long *pFVar19;
  FT_Long *pFVar20;
  byte *pbVar21;
  byte *pbVar22;
  
  pFVar3 = decoder->stack;
  decoder->top = pFVar3;
  decoder->zone = decoder->zones;
  (decoder->builder).parse_state = T1_Parse_Start;
  decoder->zones[0].base = charstring_base;
  pbVar15 = charstring_base + charstring_len;
  decoder->zones[0].limit = pbVar15;
  decoder->zones[0].cursor = charstring_base;
  lVar17 = 0x8e0;
  bVar8 = false;
  while (charstring_base < pbVar15) {
    plVar6 = decoder->top;
    pbVar21 = charstring_base + 1;
    bVar5 = *charstring_base;
    uVar13 = (uint)bVar5;
    bVar14 = bVar8;
    switch(bVar5) {
    case 1:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
    case 0xe:
    case 0xf:
    case 0x15:
    case 0x16:
    case 0x1e:
    case 0x1f:
      goto switchD_001f2580_caseD_1;
    case 2:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
switchD_001f2580_caseD_2:
      if (bVar5 < 0x20) {
        return 0xa0;
      }
      if (bVar5 < 0xf7) {
        uVar13 = uVar13 - 0x8b;
        pbVar22 = pbVar21;
      }
      else {
        pbVar22 = charstring_base + 2;
        if (pbVar15 < pbVar22) {
          return 0xa0;
        }
        if (bVar5 < 0xfb) {
          uVar13 = (uVar13 * 0x100 + (uint)*pbVar21) - 0xf694;
        }
        else {
          uVar13 = 0xfa94 - (uVar13 * 0x100 | (uint)*pbVar21);
        }
      }
      uVar11 = uVar13 << 0x10;
      if (bVar8) {
        uVar11 = uVar13;
      }
      goto LAB_001f2815;
    case 10:
      uVar13 = 0x16;
      break;
    case 0xb:
      uVar13 = 0x18;
      break;
    case 0xc:
      if (pbVar15 <= pbVar21) {
        return 0xa0;
      }
      pbVar21 = charstring_base + 2;
      if (charstring_base[1] == 7) {
        uVar13 = 4;
        break;
      }
      uVar13 = 0x14;
      pbVar22 = pbVar21;
      if (charstring_base[1] != 0xc) {
        return 0xa0;
      }
      goto LAB_001f264d;
    case 0xd:
      uVar13 = 2;
      break;
    default:
      if (uVar13 != 0xff) goto switchD_001f2580_caseD_2;
      pbVar22 = charstring_base + 5;
      if (pbVar22 <= pbVar15) {
        uVar13 = *(uint *)(charstring_base + 1);
        uVar11 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8;
        uVar13 = uVar11 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
        if (uVar13 - 0x7d01 < 0xffff05ff) {
          uVar11 = uVar13;
          bVar14 = true;
          if (bVar8) {
            return 0xa0;
          }
        }
        else {
          uVar11 = uVar11 << 0x10;
          if (bVar8) {
            uVar11 = uVar13;
          }
        }
LAB_001f2815:
        if ((long)plVar6 - (long)pFVar3 < 0x7f9) {
          *plVar6 = (long)(int)uVar11;
          pFVar20 = plVar6 + 1;
          bVar8 = bVar14;
          goto LAB_001f2832;
        }
      }
      goto switchD_001f2580_caseD_1;
    }
    pbVar22 = pbVar21;
    if (bVar8) {
      return 0xa0;
    }
LAB_001f264d:
    if ((long)plVar6 - (long)pFVar3 >> 3 < (long)t1_args_count[uVar13]) {
      return 0xa1;
    }
    uVar11 = uVar13 - 2 >> 1;
    if (0xb < uVar11) {
      return 0xa0;
    }
    pFVar19 = plVar6 + -(long)t1_args_count[uVar13];
    switch(uVar11) {
    case 0:
      (decoder->builder).parse_state = T1_Parse_Have_Width;
      pFVar1 = &(decoder->builder).left_bearing;
      pFVar1->x = pFVar1->x + *pFVar19;
      (decoder->builder).advance.x = pFVar19[1];
      FVar9 = 0;
      goto LAB_001f288c;
    case 1:
      (decoder->builder).parse_state = T1_Parse_Have_Width;
      pFVar1 = &(decoder->builder).left_bearing;
      pFVar1->x = pFVar1->x + *pFVar19;
      pFVar2 = &(decoder->builder).left_bearing.y;
      *pFVar2 = *pFVar2 + pFVar19[1];
      (decoder->builder).advance.x = pFVar19[2];
      FVar9 = pFVar19[3];
LAB_001f288c:
      (decoder->builder).advance.y = FVar9;
      return 0;
    default:
      goto switchD_001f2580_caseD_1;
    case 9:
      pFVar20 = pFVar19 + 1;
      FVar9 = FT_DivFix(*pFVar19,pFVar19[1]);
      *pFVar19 = FVar9;
      bVar8 = false;
      goto LAB_001f2832;
    case 10:
      uVar13 = (uint)*(short *)((long)pFVar19 + 2);
      if (decoder->subrs_hash != (FT_Hash)0x0) {
        psVar10 = ft_hash_num_lookup(uVar13,decoder->subrs_hash);
        if (psVar10 == (size_t *)0x0) {
          return 0xa0;
        }
        uVar13 = (uint)*psVar10;
      }
      if ((int)uVar13 < 0) {
        return 0xa0;
      }
      if (decoder->num_subrs <= (int)uVar13) {
        return 0xa0;
      }
      if (0xa48 < lVar17) {
        return 0xa0;
      }
      puVar4 = (ulong *)((long)&(decoder->builder).memory + lVar17);
      pTVar12 = (T1_Decoder_Zone)(puVar4 + 3);
      *puVar4 = (ulong)pbVar22;
      ppFVar7 = decoder->subrs;
      pbVar22 = ppFVar7[uVar13];
      puVar4[4] = (ulong)pbVar22;
      if (decoder->subrs_len == (FT_UInt *)0x0) {
        uVar16 = (ulong)(uint)decoder->lenIV;
        if (decoder->lenIV < 1) {
          uVar16 = 0;
        }
        pbVar22 = pbVar22 + uVar16;
        puVar4[4] = (ulong)pbVar22;
        pbVar15 = ppFVar7[(ulong)uVar13 + 1];
      }
      else {
        pbVar15 = pbVar22 + decoder->subrs_len[uVar13];
      }
      puVar4[5] = (ulong)pbVar15;
      pTVar12->cursor = pbVar22;
      if (pbVar22 == (byte *)0x0) {
        return 0xa0;
      }
      lVar18 = lVar17 + 0x18;
      break;
    case 0xb:
      if (lVar17 < 0x8e1) {
        return 0xa0;
      }
      pTVar12 = (T1_Decoder_Zone)((long)decoder + lVar17 + -0x18);
      lVar18 = lVar17 + -0x18;
      pbVar22 = pTVar12->cursor;
      pbVar15 = *(byte **)((long)decoder + lVar17 + -8);
    }
    decoder->zone = pTVar12;
    lVar17 = lVar18;
    pFVar20 = pFVar19;
LAB_001f2832:
    decoder->top = pFVar20;
    charstring_base = pbVar22;
  }
switchD_001f2580_caseD_1:
  return 0xa0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  t1_decoder_parse_metrics( T1_Decoder  decoder,
                            FT_Byte*    charstring_base,
                            FT_UInt     charstring_len )
  {
    T1_Decoder_Zone  zone;
    FT_Byte*         ip;
    FT_Byte*         limit;
    T1_Builder       builder = &decoder->builder;
    FT_Bool          large_int;

#ifdef FT_DEBUG_LEVEL_TRACE
    FT_Bool          bol = TRUE;
#endif


    /* First of all, initialize the decoder */
    decoder->top  = decoder->stack;
    decoder->zone = decoder->zones;
    zone          = decoder->zones;

    builder->parse_state = T1_Parse_Start;

    zone->base           = charstring_base;
    limit = zone->limit  = charstring_base + charstring_len;
    ip    = zone->cursor = zone->base;

    large_int = FALSE;

    /* now, execute loop */
    while ( ip < limit )
    {
      FT_Long*     top   = decoder->top;
      T1_Operator  op    = op_none;
      FT_Int32     value = 0;


#ifdef FT_DEBUG_LEVEL_TRACE
      if ( bol )
      {
        FT_TRACE5(( " (%ld)", decoder->top - decoder->stack ));
        bol = FALSE;
      }
#endif

      /**********************************************************************
       *
       * Decode operator or operand
       *
       */

      /* first of all, decompress operator or value */
      switch ( *ip++ )
      {
      case 1:
      case 3:
      case 4:
      case 5:
      case 6:
      case 7:
      case 8:
      case 9:
      case 14:
      case 15:
      case 21:
      case 22:
      case 30:
      case 31:
        goto No_Width;

      case 10:
        op = op_callsubr;
        break;
      case 11:
        op = op_return;
        break;

      case 13:
        op = op_hsbw;
        break;

      case 12:
        if ( ip >= limit )
        {
          FT_ERROR(( "t1_decoder_parse_metrics:"
                     " invalid escape (12+EOF)\n" ));
          goto Syntax_Error;
        }

        switch ( *ip++ )
        {
        case 7:
          op = op_sbw;
          break;
        case 12:
          op = op_div;
          break;

        default:
          goto No_Width;
        }
        break;

      case 255:    /* four bytes integer */
        if ( ip + 4 > limit )
        {
          FT_ERROR(( "t1_decoder_parse_metrics:"
                     " unexpected EOF in integer\n" ));
          goto Syntax_Error;
        }

        value = (FT_Int32)( ( (FT_UInt32)ip[0] << 24 ) |
                            ( (FT_UInt32)ip[1] << 16 ) |
                            ( (FT_UInt32)ip[2] << 8  ) |
                              (FT_UInt32)ip[3]         );
        ip += 4;

        /* According to the specification, values > 32000 or < -32000 must */
        /* be followed by a `div' operator to make the result be in the    */
        /* range [-32000;32000].  We expect that the second argument of    */
        /* `div' is not a large number.  Additionally, we don't handle     */
        /* stuff like `<large1> <large2> <num> div <num> div' or           */
        /* <large1> <large2> <num> div div'.  This is probably not allowed */
        /* anyway.                                                         */
        if ( value > 32000 || value < -32000 )
        {
          if ( large_int )
          {
            FT_ERROR(( "t1_decoder_parse_metrics:"
                       " no `div' after large integer\n" ));
            goto Syntax_Error;
          }
          else
            large_int = TRUE;
        }
        else
        {
          if ( !large_int )
            value = (FT_Int32)( (FT_UInt32)value << 16 );
        }

        break;

      default:
        if ( ip[-1] >= 32 )
        {
          if ( ip[-1] < 247 )
            value = (FT_Int32)ip[-1] - 139;
          else
          {
            if ( ++ip > limit )
            {
              FT_ERROR(( "t1_decoder_parse_metrics:"
                         " unexpected EOF in integer\n" ));
              goto Syntax_Error;
            }

            if ( ip[-2] < 251 )
              value =    ( ( ip[-2] - 247 ) * 256 ) + ip[-1] + 108;
            else
              value = -( ( ( ip[-2] - 251 ) * 256 ) + ip[-1] + 108 );
          }

          if ( !large_int )
            value = (FT_Int32)( (FT_UInt32)value << 16 );
        }
        else
        {
          FT_ERROR(( "t1_decoder_parse_metrics:"
                     " invalid byte (%d)\n", ip[-1] ));
          goto Syntax_Error;
        }
      }

      if ( large_int && !( op == op_none || op == op_div ) )
      {
        FT_ERROR(( "t1_decoder_parse_metrics:"
                   " no `div' after large integer\n" ));
        goto Syntax_Error;
      }

      /**********************************************************************
       *
       * Push value on stack, or process operator
       *
       */
      if ( op == op_none )
      {
        if ( top - decoder->stack >= T1_MAX_CHARSTRINGS_OPERANDS )
        {
          FT_ERROR(( "t1_decoder_parse_metrics: stack overflow\n" ));
          goto Syntax_Error;
        }

#ifdef FT_DEBUG_LEVEL_TRACE
        if ( large_int )
          FT_TRACE4(( " %d", value ));
        else
          FT_TRACE4(( " %d", value / 65536 ));
#endif

        *top++       = value;
        decoder->top = top;
      }
      else  /* general operator */
      {
        FT_Int  num_args = t1_args_count[op];


        FT_ASSERT( num_args >= 0 );

        if ( top - decoder->stack < num_args )
          goto Stack_Underflow;

#ifdef FT_DEBUG_LEVEL_TRACE

        switch ( op )
        {
        case op_callsubr:
        case op_div:
        case op_return:
          break;

        default:
          if ( top - decoder->stack != num_args )
            FT_TRACE0(( "t1_decoder_parse_metrics:"
                        " too much operands on the stack"
                        " (seen %ld, expected %d)\n",
                        top - decoder->stack, num_args ));
          break;
        }

#endif /* FT_DEBUG_LEVEL_TRACE */

        top -= num_args;

        switch ( op )
        {
        case op_hsbw:
          FT_TRACE4(( " hsbw" ));

          builder->parse_state = T1_Parse_Have_Width;

          builder->left_bearing.x = ADD_LONG( builder->left_bearing.x,
                                              top[0] );

          builder->advance.x = top[1];
          builder->advance.y = 0;

          /* we only want to compute the glyph's metrics */
          /* (lsb + advance width) without loading the   */
          /* rest of it; so exit immediately             */
          FT_TRACE4(( "\n" ));
          return FT_Err_Ok;

        case op_sbw:
          FT_TRACE4(( " sbw" ));

          builder->parse_state = T1_Parse_Have_Width;

          builder->left_bearing.x = ADD_LONG( builder->left_bearing.x,
                                              top[0] );
          builder->left_bearing.y = ADD_LONG( builder->left_bearing.y,
                                              top[1] );

          builder->advance.x = top[2];
          builder->advance.y = top[3];

          /* we only want to compute the glyph's metrics */
          /* (lsb + advance width), without loading the  */
          /* rest of it; so exit immediately             */
          FT_TRACE4(( "\n" ));
          return FT_Err_Ok;

        case op_div:
          FT_TRACE4(( " div" ));

          /* if `large_int' is set, we divide unscaled numbers; */
          /* otherwise, we divide numbers in 16.16 format --    */
          /* in both cases, it is the same operation            */
          *top = FT_DivFix( top[0], top[1] );
          top++;

          large_int = FALSE;
          break;

        case op_callsubr:
          {
            FT_Int  idx;


            FT_TRACE4(( " callsubr" ));

            idx = Fix2Int( top[0] );

            if ( decoder->subrs_hash )
            {
              size_t*  val = ft_hash_num_lookup( idx,
                                                 decoder->subrs_hash );


              if ( val )
                idx = *val;
              else
                idx = -1;
            }

            if ( idx < 0 || idx >= decoder->num_subrs )
            {
              FT_ERROR(( "t1_decoder_parse_metrics:"
                         " invalid subrs index\n" ));
              goto Syntax_Error;
            }

            if ( zone - decoder->zones >= T1_MAX_SUBRS_CALLS )
            {
              FT_ERROR(( "t1_decoder_parse_metrics:"
                         " too many nested subrs\n" ));
              goto Syntax_Error;
            }

            zone->cursor = ip;  /* save current instruction pointer */

            zone++;

            /* The Type 1 driver stores subroutines without the seed bytes. */
            /* The CID driver stores subroutines with seed bytes.  This     */
            /* case is taken care of when decoder->subrs_len == 0.          */
            zone->base = decoder->subrs[idx];

            if ( decoder->subrs_len )
              zone->limit = zone->base + decoder->subrs_len[idx];
            else
            {
              /* We are using subroutines from a CID font.  We must adjust */
              /* for the seed bytes.                                       */
              zone->base  += ( decoder->lenIV >= 0 ? decoder->lenIV : 0 );
              zone->limit  = decoder->subrs[idx + 1];
            }

            zone->cursor = zone->base;

            if ( !zone->base )
            {
              FT_ERROR(( "t1_decoder_parse_metrics:"
                         " invoking empty subrs\n" ));
              goto Syntax_Error;
            }

            decoder->zone = zone;
            ip            = zone->base;
            limit         = zone->limit;
            break;
          }

        case op_return:
          FT_TRACE4(( " return" ));

          if ( zone <= decoder->zones )
          {
            FT_ERROR(( "t1_decoder_parse_metrics:"
                       " unexpected return\n" ));
            goto Syntax_Error;
          }

          zone--;
          ip            = zone->cursor;
          limit         = zone->limit;
          decoder->zone = zone;
          break;

        default:
          FT_ERROR(( "t1_decoder_parse_metrics:"
                     " unhandled opcode %d\n", op ));
          goto Syntax_Error;
        }

        decoder->top = top;

      } /* general operator processing */

    } /* while ip < limit */

    FT_TRACE4(( "..end..\n" ));
    FT_TRACE4(( "\n" ));

  No_Width:
    FT_ERROR(( "t1_decoder_parse_metrics:"
               " no width, found op %d instead\n",
               ip[-1] ));
  Syntax_Error:
    return FT_THROW( Syntax_Error );

  Stack_Underflow:
    return FT_THROW( Stack_Underflow );
  }